

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_bary3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *uv,REF_DBL *bary)

{
  double local_e8;
  double local_d8;
  double local_d0;
  double local_c0;
  double local_b8;
  double local_a8;
  int local_a0;
  REF_INT i;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom2;
  REF_INT geom1;
  REF_INT geom0;
  REF_DBL total;
  REF_DBL RStack_68;
  REF_INT sens;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_DBL *bary_local;
  REF_DBL *uv_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  ref_geom_local._4_4_ =
       ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv1 + 1,(REF_INT *)((long)&total + 4));
  if (ref_geom_local._4_4_ == 0) {
    ref_geom_local._4_4_ =
         ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv2 + 1,(REF_INT *)((long)&total + 4));
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ =
           ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,&stack0xffffffffffffff98,
                             (REF_INT *)((long)&total + 4));
      if (ref_geom_local._4_4_ == 0) {
        ref_geom_local._4_4_ = ref_geom_find(ref_geom,*nodes,2,nodes[3],&geom2);
        if (ref_geom_local._4_4_ == 0) {
          if (ref_geom->descr[geom2 * 6 + 4] != 0) {
            if (ref_geom->descr[geom2 * 6 + 4] < 1) {
              uv1[1] = *uv;
            }
            else {
              uv0[0] = uv[1];
            }
          }
          ref_geom_local._4_4_ =
               ref_geom_find(ref_geom,nodes[1],2,nodes[3],&ref_private_macro_code_rss);
          if (ref_geom_local._4_4_ == 0) {
            if (ref_geom->descr[ref_private_macro_code_rss * 6 + 4] != 0) {
              if (ref_geom->descr[ref_private_macro_code_rss * 6 + 4] < 1) {
                uv2[1] = *uv;
              }
              else {
                uv1[0] = uv[1];
              }
            }
            ref_geom_local._4_4_ =
                 ref_geom_find(ref_geom,nodes[2],2,nodes[3],&ref_private_macro_code_rss_1);
            if (ref_geom_local._4_4_ == 0) {
              if (ref_geom->descr[ref_private_macro_code_rss_1 * 6 + 4] != 0) {
                if (ref_geom->descr[ref_private_macro_code_rss_1 * 6 + 4] < 1) {
                  RStack_68 = *uv;
                }
                else {
                  uv2[0] = uv[1];
                }
              }
              *bary = uv2[1] * uv2[0] +
                      -*uv * uv2[0] +
                      -RStack_68 * uv1[0] + *uv * uv1[0] + -uv2[1] * uv[1] + RStack_68 * uv[1];
              bary[1] = *uv * uv2[0] +
                        -uv1[1] * uv2[0] +
                        -RStack_68 * uv[1] + uv1[1] * uv[1] + -*uv * uv0[0] + RStack_68 * uv0[0];
              bary[2] = uv2[1] * uv[1] +
                        -uv1[1] * uv[1] +
                        -*uv * uv1[0] + uv1[1] * uv1[0] + -uv2[1] * uv0[0] + *uv * uv0[0];
              _geom1 = *bary + bary[1] + bary[2];
              if (_geom1 * 1e+20 <= 0.0) {
                local_a8 = -(_geom1 * 1e+20);
              }
              else {
                local_a8 = _geom1 * 1e+20;
              }
              if (*bary <= 0.0) {
                local_b8 = -*bary;
              }
              else {
                local_b8 = *bary;
              }
              if (local_b8 < local_a8) {
                if (_geom1 * 1e+20 <= 0.0) {
                  local_c0 = -(_geom1 * 1e+20);
                }
                else {
                  local_c0 = _geom1 * 1e+20;
                }
                if (bary[1] <= 0.0) {
                  local_d0 = -bary[1];
                }
                else {
                  local_d0 = bary[1];
                }
                if (local_d0 < local_c0) {
                  if (_geom1 * 1e+20 <= 0.0) {
                    local_d8 = -(_geom1 * 1e+20);
                  }
                  else {
                    local_d8 = _geom1 * 1e+20;
                  }
                  if (bary[2] <= 0.0) {
                    local_e8 = -bary[2];
                  }
                  else {
                    local_e8 = bary[2];
                  }
                  if (local_e8 < local_d8) {
                    *bary = *bary / _geom1;
                    bary[1] = bary[1] / _geom1;
                    bary[2] = bary[2] / _geom1;
                    return 0;
                  }
                }
              }
              printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",_geom1,*bary,
                     bary[1],bary[2],
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf4f,"ref_geom_bary3");
              for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
                bary[local_a0] = 0.0;
              }
              ref_geom_local._4_4_ = 4;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf34,"ref_geom_bary3",(ulong)ref_geom_local._4_4_,"g2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xf2b,"ref_geom_bary3",(ulong)ref_geom_local._4_4_,"g1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xf22,"ref_geom_bary3",(ulong)ref_geom_local._4_4_,"g0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xf20,"ref_geom_bary3",(ulong)ref_geom_local._4_4_,"uv2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf1e,
             "ref_geom_bary3",(ulong)ref_geom_local._4_4_,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf1c,
           "ref_geom_bary3",(ulong)ref_geom_local._4_4_,"uv0");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary3(REF_GEOM ref_geom, REF_INT *nodes,
                                  REF_DBL *uv, REF_DBL *bary) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;
  REF_DBL total;
  REF_INT geom0, geom1, geom2;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], &geom0), "g0");
  if (0 != ref_geom_degen(ref_geom, geom0)) {
    if (0 < ref_geom_degen(ref_geom, geom0)) {
      uv0[1] = uv[1];
    } else {
      uv0[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], &geom1), "g1");
  if (0 != ref_geom_degen(ref_geom, geom1)) {
    if (0 < ref_geom_degen(ref_geom, geom1)) {
      uv1[1] = uv[1];
    } else {
      uv1[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], &geom2), "g2");
  if (0 != ref_geom_degen(ref_geom, geom2)) {
    if (0 < ref_geom_degen(ref_geom, geom2)) {
      uv2[1] = uv[1];
    } else {
      uv2[0] = uv[0];
    }
  }

  bary[0] = -uv1[0] * uv[1] + uv2[0] * uv[1] + uv[0] * uv1[1] -
            uv2[0] * uv1[1] - uv[0] * uv2[1] + uv1[0] * uv2[1];
  bary[1] = -uv[0] * uv0[1] + uv2[0] * uv0[1] + uv0[0] * uv[1] -
            uv2[0] * uv[1] - uv0[0] * uv2[1] + uv[0] * uv2[1];
  bary[2] = -uv1[0] * uv0[1] + uv[0] * uv0[1] + uv0[0] * uv1[1] -
            uv[0] * uv1[1] - uv0[0] * uv[1] + uv1[0] * uv[1];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}